

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtUnionFind.cpp
# Opt level: O1

void __thiscall cbtUnionFind::allocate(cbtUnionFind *this,int N)

{
  int iVar1;
  cbtElement *ptr;
  cbtElement *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  iVar1 = (this->m_elements).m_size;
  lVar5 = (long)iVar1;
  if ((iVar1 <= N) && (iVar1 < N)) {
    if ((this->m_elements).m_capacity < N) {
      if (N == 0) {
        pcVar2 = (cbtElement *)0x0;
      }
      else {
        pcVar2 = (cbtElement *)cbtAlignedAllocInternal((long)N << 3,0x10);
      }
      lVar3 = (long)(this->m_elements).m_size;
      if (0 < lVar3) {
        lVar4 = 0;
        do {
          pcVar2[lVar4] = (this->m_elements).m_data[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
      }
      ptr = (this->m_elements).m_data;
      if (ptr != (cbtElement *)0x0) {
        if ((this->m_elements).m_ownsMemory == true) {
          cbtAlignedFreeInternal(ptr);
        }
        (this->m_elements).m_data = (cbtElement *)0x0;
      }
      (this->m_elements).m_ownsMemory = true;
      (this->m_elements).m_data = pcVar2;
      (this->m_elements).m_capacity = N;
    }
    if (iVar1 < N) {
      do {
        pcVar2 = (this->m_elements).m_data + lVar5;
        pcVar2->m_id = 0;
        pcVar2->m_sz = 0;
        lVar5 = lVar5 + 1;
      } while (N != lVar5);
    }
  }
  (this->m_elements).m_size = N;
  return;
}

Assistant:

void cbtUnionFind::allocate(int N)
{
	m_elements.resize(N);
}